

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  byte bVar1;
  uint uVar2;
  stbi__context *psVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  stbi_uc *psVar11;
  long lVar12;
  stbi_uc *psVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  stbi_uc *psVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  byte *pbVar22;
  stbi_uc *__dest;
  stbi__uint32 sVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  byte bVar27;
  long lVar28;
  long lVar29;
  byte *pbVar30;
  ulong uVar31;
  int iVar32;
  uint uVar33;
  int iVar34;
  uint uVar35;
  
  psVar3 = a->s;
  uVar2 = psVar3->img_n;
  uVar31 = (ulong)uVar2;
  if (uVar2 + 1 != out_n && uVar2 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                  ,0xf7d,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  uVar7 = x * out_n;
  psVar11 = (stbi_uc *)malloc((ulong)(uVar7 * y));
  a->out = psVar11;
  if (psVar11 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    iVar8 = uVar2 * x;
    uVar14 = iVar8 * depth + 7U >> 3;
    uVar9 = (uVar14 + 1) * y;
    if ((psVar3->img_x == x) && (psVar3->img_y == y)) {
      if (uVar9 == raw_len) {
LAB_0011d027:
        if (y != 0) {
          lVar21 = -(ulong)uVar7;
          lVar28 = (long)out_n;
          iVar10 = x - 1;
          lVar12 = -lVar28;
          uVar9 = 0;
          uVar19 = 0;
          do {
            uVar18 = (ulong)uVar9;
            pbVar22 = raw + 1;
            bVar5 = *raw;
            uVar25 = (ulong)bVar5;
            if (uVar25 < 5) {
              psVar11 = a->out;
              psVar17 = psVar11 + uVar7 * (int)uVar19;
              psVar13 = psVar17;
              sVar23 = x;
              uVar35 = uVar2;
              if (depth < 8) {
                if (x < uVar14) {
                  __assert_fail("img_width_bytes <= x",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                                ,0xf93,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                psVar13 = psVar17 + (uVar7 - uVar14);
                uVar35 = 1;
                sVar23 = uVar14;
              }
              if (uVar19 == 0) {
                uVar25 = (ulong)""[uVar25];
              }
              if (0 < (int)uVar35) {
                uVar26 = 0;
                do {
                  switch(uVar25) {
                  case 0:
                  case 1:
                  case 5:
                  case 6:
                    bVar6 = pbVar22[uVar26];
                    goto LAB_0011d190;
                  case 2:
                  case 4:
                    bVar6 = psVar11[uVar26 + uVar18 + lVar21];
                    break;
                  case 3:
                    bVar6 = psVar11[uVar26 + uVar18 + lVar21] >> 1;
                    break;
                  default:
                    goto switchD_0011d178_default;
                  }
                  bVar6 = bVar6 + pbVar22[uVar26];
LAB_0011d190:
                  psVar13[uVar26] = bVar6;
switchD_0011d178_default:
                  uVar26 = uVar26 + 1;
                } while (uVar35 != uVar26);
              }
              if (depth == 8) {
                if (uVar2 != out_n) {
                  psVar13[(int)uVar2] = 0xff;
                }
                pbVar22 = pbVar22 + (int)uVar2;
                lVar29 = lVar28;
              }
              else {
                pbVar22 = raw + 2;
                lVar29 = 1;
              }
              __dest = psVar13 + lVar29;
              if (depth < 8 || uVar2 == out_n) {
                uVar24 = (sVar23 - 1) * uVar2;
                switch(uVar25) {
                case 0:
                  memcpy(__dest,pbVar22,(long)(int)uVar24);
                  break;
                case 1:
                  if (0 < (int)uVar24) {
                    uVar18 = 0;
                    do {
                      __dest[uVar18] = psVar13[uVar18 + (lVar29 - (int)uVar35)] + pbVar22[uVar18];
                      uVar18 = uVar18 + 1;
                    } while (uVar24 != uVar18);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar24) {
                    uVar25 = 0;
                    do {
                      __dest[uVar25] = psVar11[uVar25 + lVar29 + uVar18 + lVar21] + pbVar22[uVar25];
                      uVar25 = uVar25 + 1;
                    } while (uVar24 != uVar25);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar24) {
                    uVar25 = 0;
                    do {
                      __dest[uVar25] =
                           (char)((uint)psVar13[uVar25 + (lVar29 - (int)uVar35)] +
                                  (uint)psVar11[uVar25 + lVar29 + uVar18 + lVar21] >> 1) +
                           pbVar22[uVar25];
                      uVar25 = uVar25 + 1;
                    } while (uVar24 != uVar25);
                  }
                  break;
                case 4:
                  if (0 < (int)uVar24) {
                    uVar25 = 0;
                    do {
                      bVar6 = psVar13[uVar25 + (lVar29 - (int)uVar35)];
                      bVar1 = psVar11[uVar25 + lVar29 + uVar18 + lVar21];
                      bVar27 = psVar11[uVar25 + ((lVar29 + uVar18) - (long)(int)uVar35) + lVar21];
                      iVar32 = ((uint)bVar1 + (uint)bVar6) - (uint)bVar27;
                      uVar15 = iVar32 - (uint)bVar6;
                      uVar20 = -uVar15;
                      if (0 < (int)uVar15) {
                        uVar20 = uVar15;
                      }
                      uVar16 = iVar32 - (uint)bVar1;
                      uVar15 = -uVar16;
                      if (0 < (int)uVar16) {
                        uVar15 = uVar16;
                      }
                      uVar33 = iVar32 - (uint)bVar27;
                      uVar16 = -uVar33;
                      if (0 < (int)uVar33) {
                        uVar16 = uVar33;
                      }
                      if (uVar15 <= uVar16) {
                        bVar27 = bVar1;
                      }
                      if (uVar16 < uVar20) {
                        bVar6 = bVar27;
                      }
                      if (uVar15 < uVar20) {
                        bVar6 = bVar27;
                      }
                      __dest[uVar25] = bVar6 + pbVar22[uVar25];
                      uVar25 = uVar25 + 1;
                    } while (uVar24 != uVar25);
                  }
                  break;
                case 5:
                  if (0 < (int)uVar24) {
                    uVar18 = 0;
                    do {
                      __dest[uVar18] =
                           (psVar13[uVar18 + (lVar29 - (int)uVar35)] >> 1) + pbVar22[uVar18];
                      uVar18 = uVar18 + 1;
                    } while (uVar24 != uVar18);
                  }
                  break;
                case 6:
                  if (0 < (int)uVar24) {
                    uVar18 = 0;
                    do {
                      __dest[uVar18] = psVar13[uVar18 + (lVar29 - (int)uVar35)] + pbVar22[uVar18];
                      uVar18 = uVar18 + 1;
                    } while (uVar24 != uVar18);
                  }
                }
                pbVar22 = pbVar22 + (int)uVar24;
              }
              else {
                if (uVar2 + 1 != out_n) {
                  __assert_fail("img_n+1 == out_n",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                                ,0xfc8,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                if ((byte)uVar25 < 7) {
                  psVar17 = psVar17 + lVar29 + lVar21;
                  switch(uVar25) {
                  case 0:
                    for (iVar32 = iVar10; iVar32 != 0; iVar32 = iVar32 + -1) {
                      if (0 < (int)uVar2) {
                        uVar18 = 0;
                        do {
                          __dest[uVar18] = pbVar22[uVar18];
                          uVar18 = uVar18 + 1;
                        } while (uVar31 != uVar18);
                      }
                      __dest[(int)uVar2] = 0xff;
                      pbVar22 = pbVar22 + (int)uVar2;
                      __dest = __dest + lVar28;
                    }
                    break;
                  case 1:
                    if (iVar10 != 0) {
                      psVar13 = psVar13 + lVar29 + lVar12;
                      iVar32 = iVar10;
                      do {
                        if (0 < (int)uVar2) {
                          uVar18 = 0;
                          do {
                            __dest[uVar18] = psVar13[uVar18] + pbVar22[uVar18];
                            uVar18 = uVar18 + 1;
                          } while (uVar31 != uVar18);
                        }
                        __dest[(int)uVar2] = 0xff;
                        pbVar22 = pbVar22 + (int)uVar2;
                        __dest = __dest + lVar28;
                        psVar13 = psVar13 + lVar28;
                        iVar32 = iVar32 + -1;
                      } while (iVar32 != 0);
                    }
                    break;
                  case 2:
                    for (iVar32 = iVar10; iVar32 != 0; iVar32 = iVar32 + -1) {
                      if (0 < (int)uVar2) {
                        uVar18 = 0;
                        do {
                          __dest[uVar18] = psVar17[uVar18] + pbVar22[uVar18];
                          uVar18 = uVar18 + 1;
                        } while (uVar31 != uVar18);
                      }
                      __dest[(int)uVar2] = 0xff;
                      pbVar22 = pbVar22 + (int)uVar2;
                      __dest = __dest + lVar28;
                      psVar17 = psVar17 + lVar28;
                    }
                    break;
                  case 3:
                    if (iVar10 != 0) {
                      psVar13 = psVar13 + lVar29 + lVar12;
                      iVar32 = iVar10;
                      do {
                        if (0 < (int)uVar2) {
                          uVar18 = 0;
                          do {
                            __dest[uVar18] =
                                 (char)((uint)psVar13[uVar18] + (uint)psVar17[uVar18] >> 1) +
                                 pbVar22[uVar18];
                            uVar18 = uVar18 + 1;
                          } while (uVar31 != uVar18);
                        }
                        __dest[(int)uVar2] = 0xff;
                        pbVar22 = pbVar22 + (int)uVar2;
                        __dest = __dest + lVar28;
                        psVar17 = psVar17 + lVar28;
                        psVar13 = psVar13 + lVar28;
                        iVar32 = iVar32 + -1;
                      } while (iVar32 != 0);
                    }
                    break;
                  case 4:
                    if (iVar10 != 0) {
                      psVar13 = psVar13 + lVar29 + lVar12;
                      psVar11 = psVar11 + lVar29 + uVar18 + (lVar12 - (ulong)uVar7);
                      iVar32 = iVar10;
                      do {
                        if (0 < (int)uVar2) {
                          uVar18 = 0;
                          do {
                            bVar6 = psVar13[uVar18];
                            bVar1 = psVar17[uVar18];
                            bVar27 = psVar11[uVar18];
                            iVar34 = ((uint)bVar1 + (uint)bVar6) - (uint)bVar27;
                            uVar24 = iVar34 - (uint)bVar6;
                            uVar35 = -uVar24;
                            if (0 < (int)uVar24) {
                              uVar35 = uVar24;
                            }
                            uVar20 = iVar34 - (uint)bVar1;
                            uVar24 = -uVar20;
                            if (0 < (int)uVar20) {
                              uVar24 = uVar20;
                            }
                            uVar15 = iVar34 - (uint)bVar27;
                            uVar20 = -uVar15;
                            if (0 < (int)uVar15) {
                              uVar20 = uVar15;
                            }
                            if (uVar24 <= uVar20) {
                              bVar27 = bVar1;
                            }
                            if (uVar20 < uVar35) {
                              bVar6 = bVar27;
                            }
                            if (uVar24 < uVar35) {
                              bVar6 = bVar27;
                            }
                            __dest[uVar18] = bVar6 + pbVar22[uVar18];
                            uVar18 = uVar18 + 1;
                          } while (uVar31 != uVar18);
                        }
                        __dest[(int)uVar2] = 0xff;
                        pbVar22 = pbVar22 + (int)uVar2;
                        __dest = __dest + lVar28;
                        psVar17 = psVar17 + lVar28;
                        psVar13 = psVar13 + lVar28;
                        psVar11 = psVar11 + lVar28;
                        iVar32 = iVar32 + -1;
                      } while (iVar32 != 0);
                    }
                    break;
                  case 5:
                    if (iVar10 != 0) {
                      psVar13 = psVar13 + lVar29 + lVar12;
                      iVar32 = iVar10;
                      do {
                        if (0 < (int)uVar2) {
                          uVar18 = 0;
                          do {
                            __dest[uVar18] = (psVar13[uVar18] >> 1) + pbVar22[uVar18];
                            uVar18 = uVar18 + 1;
                          } while (uVar31 != uVar18);
                        }
                        __dest[(int)uVar2] = 0xff;
                        pbVar22 = pbVar22 + (int)uVar2;
                        __dest = __dest + lVar28;
                        psVar13 = psVar13 + lVar28;
                        iVar32 = iVar32 + -1;
                      } while (iVar32 != 0);
                    }
                    break;
                  case 6:
                    if (iVar10 != 0) {
                      psVar13 = psVar13 + lVar29 + lVar12;
                      iVar32 = iVar10;
                      do {
                        if (0 < (int)uVar2) {
                          uVar18 = 0;
                          do {
                            __dest[uVar18] = psVar13[uVar18] + pbVar22[uVar18];
                            uVar18 = uVar18 + 1;
                          } while (uVar31 != uVar18);
                        }
                        __dest[(int)uVar2] = 0xff;
                        pbVar22 = pbVar22 + (int)uVar2;
                        __dest = __dest + lVar28;
                        psVar13 = psVar13 + lVar28;
                        iVar32 = iVar32 + -1;
                      } while (iVar32 != 0);
                    }
                  }
                }
              }
            }
            else {
              stbi__g_failure_reason = "invalid filter";
            }
            if (4 < bVar5) {
              return 0;
            }
            uVar19 = uVar19 + 1;
            uVar9 = uVar9 + uVar7;
            raw = pbVar22;
          } while (uVar19 != y);
        }
        if (y == 0 || 7 < depth) {
          return 1;
        }
        uVar9 = x - 1;
        lVar12 = (ulong)uVar7 - (ulong)uVar14;
        lVar21 = (ulong)uVar9 + 1;
        uVar35 = 0;
        uVar31 = 0;
        do {
          bVar5 = 1;
          if (color == 0) {
            bVar5 = ""[(uint)depth];
          }
          psVar11 = a->out;
          pbVar30 = psVar11 + uVar7 * (int)uVar31;
          pbVar22 = pbVar30 + ((ulong)uVar7 - (ulong)uVar14);
          uVar19 = (ulong)uVar35;
          if (depth == 4) {
            iVar10 = iVar8;
            if (1 < iVar8) {
              psVar17 = psVar11 + lVar12;
              iVar32 = iVar8;
              do {
                psVar11[uVar19] = (psVar17[uVar19] >> 4) * bVar5;
                psVar11[uVar19 + 1] = (psVar17[uVar19] & 0xf) * bVar5;
                iVar10 = iVar32 + -2;
                psVar17 = psVar17 + 1;
                psVar11 = psVar11 + 2;
                bVar4 = 3 < iVar32;
                iVar32 = iVar10;
              } while (bVar4);
              pbVar22 = psVar17 + uVar19;
              pbVar30 = psVar11 + uVar19;
            }
            if (iVar10 == 1) {
              bVar6 = *pbVar22 >> 4;
LAB_0011da5f:
              bVar5 = bVar6 * bVar5;
LAB_0011da62:
              *pbVar30 = bVar5;
            }
          }
          else if (depth == 2) {
            iVar10 = iVar8;
            if (3 < iVar8) {
              psVar17 = psVar11 + lVar12;
              iVar32 = iVar8;
              do {
                psVar11[uVar19] = (psVar17[uVar19] >> 6) * bVar5;
                psVar11[uVar19 + 1] = (psVar17[uVar19] >> 4 & 3) * bVar5;
                psVar11[uVar19 + 2] = (psVar17[uVar19] >> 2 & 3) * bVar5;
                psVar11[uVar19 + 3] = (psVar17[uVar19] & 3) * bVar5;
                iVar10 = iVar32 + -4;
                psVar17 = psVar17 + 1;
                psVar11 = psVar11 + 4;
                bVar4 = 7 < iVar32;
                iVar32 = iVar10;
              } while (bVar4);
              pbVar22 = psVar17 + uVar19;
              pbVar30 = psVar11 + uVar19;
            }
            if (0 < iVar10) {
              *pbVar30 = (*pbVar22 >> 6) * bVar5;
              pbVar30 = pbVar30 + 1;
            }
            if (1 < iVar10) {
              *pbVar30 = (*pbVar22 >> 4 & 3) * bVar5;
              pbVar30 = pbVar30 + 1;
            }
            if (iVar10 == 3) {
              bVar6 = *pbVar22 >> 2 & 3;
              goto LAB_0011da5f;
            }
          }
          else if (depth == 1) {
            iVar10 = iVar8;
            if (7 < iVar8) {
              psVar17 = psVar11 + lVar12;
              iVar32 = iVar8;
              do {
                psVar11[uVar19] = (char)psVar17[uVar19] >> 7 & bVar5;
                psVar11[uVar19 + 1] = (char)(psVar17[uVar19] * '\x02') >> 7 & bVar5;
                psVar11[uVar19 + 2] = (char)(psVar17[uVar19] << 2) >> 7 & bVar5;
                psVar11[uVar19 + 3] = (char)(psVar17[uVar19] << 3) >> 7 & bVar5;
                psVar11[uVar19 + 4] = (char)(psVar17[uVar19] << 4) >> 7 & bVar5;
                psVar11[uVar19 + 5] = (char)(psVar17[uVar19] << 5) >> 7 & bVar5;
                psVar11[uVar19 + 6] = (char)(psVar17[uVar19] << 6) >> 7 & bVar5;
                bVar6 = bVar5;
                if ((psVar17[uVar19] & 1) == 0) {
                  bVar6 = 0;
                }
                psVar11[uVar19 + 7] = bVar6;
                iVar10 = iVar32 + -8;
                psVar17 = psVar17 + 1;
                psVar11 = psVar11 + 8;
                bVar4 = 0xf < iVar32;
                iVar32 = iVar10;
              } while (bVar4);
              pbVar22 = psVar17 + uVar19;
              pbVar30 = psVar11 + uVar19;
            }
            if (0 < iVar10) {
              *pbVar30 = (char)*pbVar22 >> 7 & bVar5;
              pbVar30 = pbVar30 + 1;
            }
            if (1 < iVar10) {
              *pbVar30 = (char)(*pbVar22 * '\x02') >> 7 & bVar5;
              pbVar30 = pbVar30 + 1;
            }
            if (2 < iVar10) {
              *pbVar30 = (char)(*pbVar22 << 2) >> 7 & bVar5;
              pbVar30 = pbVar30 + 1;
            }
            if (3 < iVar10) {
              *pbVar30 = (char)(*pbVar22 << 3) >> 7 & bVar5;
              pbVar30 = pbVar30 + 1;
            }
            if (4 < iVar10) {
              *pbVar30 = (char)(*pbVar22 << 4) >> 7 & bVar5;
              pbVar30 = pbVar30 + 1;
            }
            if (5 < iVar10) {
              *pbVar30 = (char)(*pbVar22 << 5) >> 7 & bVar5;
              pbVar30 = pbVar30 + 1;
            }
            if (iVar10 == 7) {
              bVar5 = (char)(*pbVar22 << 6) >> 7 & bVar5;
              goto LAB_0011da62;
            }
          }
          if (uVar2 != out_n) {
            psVar11 = a->out;
            if (uVar2 == 1) {
              lVar28 = lVar21;
              if (-1 < (int)uVar9) {
                do {
                  psVar11[lVar28 * 2 + (uVar19 - 1)] = 0xff;
                  psVar11[lVar28 * 2 + (uVar19 - 2)] = psVar11[lVar28 + (uVar19 - 1)];
                  lVar29 = lVar28 + -1;
                  bVar4 = 0 < lVar28;
                  lVar28 = lVar29;
                } while (lVar29 != 0 && bVar4);
              }
            }
            else {
              if (uVar2 != 3) {
                __assert_fail("img_n == 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                              ,0x1018,
                              "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                             );
              }
              if (-1 < (int)uVar9) {
                psVar17 = psVar11 + (ulong)uVar9 * 3 + 2 + uVar19;
                lVar28 = lVar21;
                do {
                  psVar11[lVar28 * 4 + (uVar19 - 1)] = 0xff;
                  psVar11[lVar28 * 4 + (uVar19 - 2)] = *psVar17;
                  psVar11[lVar28 * 4 + (uVar19 - 3)] = psVar17[-1];
                  psVar11[lVar28 * 4 + (uVar19 - 4)] = psVar17[-2];
                  psVar17 = psVar17 + -3;
                  lVar29 = lVar28 + -1;
                  bVar4 = 0 < lVar28;
                  lVar28 = lVar29;
                } while (lVar29 != 0 && bVar4);
              }
            }
          }
          uVar31 = uVar31 + 1;
          uVar35 = uVar35 + uVar7;
          if (uVar31 == y) {
            return 1;
          }
        } while( true );
      }
    }
    else if (uVar9 <= raw_len) goto LAB_0011d027;
    stbi__g_failure_reason = "not enough pixels";
  }
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc(x * y * out_n); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   if (s->img_x == x && s->img_y == y) {
      if (raw_len != img_len) return stbi__err("not enough pixels","Corrupt PNG");
   } else { // interlaced:
      if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");
   }

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior = cur - stride;
      int filter = *raw++;
      int filter_bytes = img_n;
      int width = x;
      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*img_n;
         #define CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); break;
         }
         #undef CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[img_n]=255,raw+=img_n,cur+=out_n,prior+=out_n) \
                   for (k=0; k < img_n; ++k)
         switch (filter) {
            CASE(STBI__F_none)         cur[k] = raw[k]; break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-out_n]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-out_n])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],prior[k],prior[k-out_n])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-out_n] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],0,0)); break;
         }
         #undef CASE
      }
   }

   // we make a separate pass to expand bits to pixels; for performance,
   // this could run two scanlines behind the above code, so it won't
   // intefere with filtering but will still be in the cache.
   if (depth < 8) {
      for (j=0; j < y; ++j) {
         stbi_uc *cur = a->out + stride*j;
         stbi_uc *in  = a->out + stride*j + x*out_n - img_width_bytes;
         // unpack 1/2/4-bit into a 8-bit buffer. allows us to keep the common 8-bit path optimal at minimal cost for 1/2/4-bit
         // png guarante byte alignment, if width is not multiple of 8/4/2 we'll decode dummy trailing data that will be skipped in the later loop
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range

         // note that the final byte might overshoot and write more data than desired.
         // we can allocate enough data that this never writes out of memory, but it
         // could also overwrite the next scanline. can it overwrite non-empty data
         // on the next scanline? yes, consider 1-pixel-wide scanlines with 1-bit-per-pixel.
         // so we need to explicitly clamp the final ones

         if (depth == 4) {
            for (k=x*img_n; k >= 2; k-=2, ++in) {
               *cur++ = scale * ((*in >> 4)       );
               *cur++ = scale * ((*in     ) & 0x0f);
            }
            if (k > 0) *cur++ = scale * ((*in >> 4)       );
         } else if (depth == 2) {
            for (k=x*img_n; k >= 4; k-=4, ++in) {
               *cur++ = scale * ((*in >> 6)       );
               *cur++ = scale * ((*in >> 4) & 0x03);
               *cur++ = scale * ((*in >> 2) & 0x03);
               *cur++ = scale * ((*in     ) & 0x03);
            }
            if (k > 0) *cur++ = scale * ((*in >> 6)       );
            if (k > 1) *cur++ = scale * ((*in >> 4) & 0x03);
            if (k > 2) *cur++ = scale * ((*in >> 2) & 0x03);
         } else if (depth == 1) {
            for (k=x*img_n; k >= 8; k-=8, ++in) {
               *cur++ = scale * ((*in >> 7)       );
               *cur++ = scale * ((*in >> 6) & 0x01);
               *cur++ = scale * ((*in >> 5) & 0x01);
               *cur++ = scale * ((*in >> 4) & 0x01);
               *cur++ = scale * ((*in >> 3) & 0x01);
               *cur++ = scale * ((*in >> 2) & 0x01);
               *cur++ = scale * ((*in >> 1) & 0x01);
               *cur++ = scale * ((*in     ) & 0x01);
            }
            if (k > 0) *cur++ = scale * ((*in >> 7)       );
            if (k > 1) *cur++ = scale * ((*in >> 6) & 0x01);
            if (k > 2) *cur++ = scale * ((*in >> 5) & 0x01);
            if (k > 3) *cur++ = scale * ((*in >> 4) & 0x01);
            if (k > 4) *cur++ = scale * ((*in >> 3) & 0x01);
            if (k > 5) *cur++ = scale * ((*in >> 2) & 0x01);
            if (k > 6) *cur++ = scale * ((*in >> 1) & 0x01);
         }
         if (img_n != out_n) {
            // insert alpha = 255
            stbi_uc *cur = a->out + stride*j;
            int i;
            if (img_n == 1) {
               for (i=x-1; i >= 0; --i) {
                  cur[i*2+1] = 255;
                  cur[i*2+0] = cur[i];
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i=x-1; i >= 0; --i) {
                  cur[i*4+3] = 255;
                  cur[i*4+2] = cur[i*3+2];
                  cur[i*4+1] = cur[i*3+1];
                  cur[i*4+0] = cur[i*3+0];
               }
            }
         }
      }
   }

   return 1;
}